

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcore.c
# Opt level: O2

FilePathList LoadDirectoryFiles(char *dirPath)

{
  FilePathList FVar1;
  DIR *__dirp;
  dirent *pdVar2;
  char **ppcVar3;
  char *pcVar4;
  uint uVar5;
  uint uVar6;
  uint i;
  ulong uVar7;
  FilePathList files;
  
  files.capacity = 0;
  files.count = 0;
  files.paths = (char **)0x0;
  __dirp = opendir(dirPath);
  if (__dirp == (DIR *)0x0) {
    pcVar4 = "FILEIO: Failed to open requested directory";
  }
  else {
    uVar6 = 0;
LAB_00160409:
    pdVar2 = readdir(__dirp);
    if (pdVar2 != (dirent *)0x0) {
      uVar5 = 1;
      if (pdVar2->d_name[0] == '.') goto code_r0x0016041c;
      goto LAB_00160439;
    }
    files.capacity = uVar6;
    ppcVar3 = (char **)malloc((ulong)uVar6 * 8);
    files.paths = ppcVar3;
    for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
      pcVar4 = (char *)malloc(0x1000);
      ppcVar3[uVar7] = pcVar4;
    }
    closedir(__dirp);
    ScanDirectoryFiles(dirPath,&files,(char *)0x0);
    if (files.count == files.capacity) goto LAB_001604ae;
    pcVar4 = "FILEIO: Read files count do not match capacity allocated";
  }
  TraceLog(4,pcVar4);
LAB_001604ae:
  FVar1.count = files.count;
  FVar1.capacity = files.capacity;
  FVar1.paths = files.paths;
  return FVar1;
code_r0x0016041c:
  if (pdVar2->d_name[1] != '\0') {
    if (pdVar2->d_name[1] == '.') {
      uVar5 = (uint)(pdVar2->d_name[2] != '\0');
    }
LAB_00160439:
    uVar6 = uVar6 + uVar5;
  }
  goto LAB_00160409;
}

Assistant:

FilePathList LoadDirectoryFiles(const char *dirPath)
{
    FilePathList files = { 0 };
    unsigned int fileCounter = 0;

    struct dirent *entity;
    DIR *dir = opendir(dirPath);

    if (dir != NULL) // It's a directory
    {
        // SCAN 1: Count files
        while ((entity = readdir(dir)) != NULL)
        {
            // NOTE: We skip '.' (current dir) and '..' (parent dir) filepaths
            if ((strcmp(entity->d_name, ".") != 0) && (strcmp(entity->d_name, "..") != 0)) fileCounter++;
        }

        // Memory allocation for dirFileCount
        files.capacity = fileCounter;
        files.paths = (char **)RL_MALLOC(files.capacity*sizeof(char *));
        for (unsigned int i = 0; i < files.capacity; i++) files.paths[i] = (char *)RL_MALLOC(MAX_FILEPATH_LENGTH*sizeof(char));

        closedir(dir);

        // SCAN 2: Read filepaths
        // NOTE: Directory paths are also registered
        ScanDirectoryFiles(dirPath, &files, NULL);

        // Security check: read files.count should match fileCounter
        if (files.count != files.capacity) TRACELOG(LOG_WARNING, "FILEIO: Read files count do not match capacity allocated");
    }
    else TRACELOG(LOG_WARNING, "FILEIO: Failed to open requested directory");  // Maybe it's a file...

    return files;
}